

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qkmsdevice.cpp
# Opt level: O2

void __thiscall QKmsDevice::createScreens(QKmsDevice *this)

{
  QArrayDataPointer<char16_t> *this_00;
  QArrayDataPointer<QPlatformScreen_*> *this_01;
  VirtualDesktopLayout VVar1;
  parameter_type t;
  bool bVar2;
  int iVar3;
  uint uVar4;
  undefined4 extraout_var;
  drmModeResPtr resources;
  drmModeConnectorPtr connector;
  QPlatformScreen *pQVar5;
  iterator iVar6;
  iterator iVar7;
  QDebug *pQVar8;
  iterator iVar9;
  iterator iVar10;
  QPoint *pQVar11;
  pointer ppQVar12;
  pointer pQVar13;
  int *piVar14;
  Data *pDVar15;
  OrderedScreen *s;
  ulong uVar16;
  OrderedScreen *orderedScreen_1;
  OrderedScreen *s_1;
  uint uVar17;
  OrderedScreen *orderedScreen;
  long lVar18;
  long in_FS_OFFSET;
  undefined1 auVar19 [16];
  uint local_300;
  QPoint local_2f0;
  undefined1 local_2e8 [8];
  undefined1 local_2e0 [16];
  QArrayDataPointer<char16_t> local_2d0;
  QDebug local_2b8;
  Stream *local_2b0;
  undefined1 local_2a8 [8];
  QPoint local_2a0;
  undefined1 local_298 [24];
  undefined8 uStack_280;
  undefined8 local_278;
  undefined1 local_268 [16];
  OrderedScreen local_258;
  ScreenInfo vinfo;
  bool ok;
  QArrayDataPointer<OrderedScreen> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_screenConfig->m_headless == true) {
    iVar3 = (*this->_vptr_QKmsDevice[6])();
    if (CONCAT44(extraout_var,iVar3) != 0) {
      qLcKmsDebug();
      if (((byte)qLcKmsDebug::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
        local_258.screen._0_4_ = 2;
        local_258.screen._4_4_ = 0;
        local_258.vinfo.virtualIndex = 0;
        local_258.vinfo.virtualPos.xp.m_i = 0;
        local_258.vinfo.virtualPos.yp.m_i = 0;
        local_258.vinfo.isPrimary = false;
        local_258.vinfo._13_3_ = 0;
        local_258.vinfo.output.name.d.d = (Data *)qLcKmsDebug::category.name;
        QMessageLogger::debug(local_268 + 0x10,"Headless mode enabled");
      }
      vinfo.virtualIndex = 0;
      vinfo.virtualPos.xp.m_i = 0;
      local_258.screen._0_4_ = 0;
      local_258.screen._4_4_ = 0;
      local_258.vinfo.virtualIndex = 0;
      local_258.vinfo.virtualPos.xp.m_i = 0;
      local_258.vinfo.virtualPos.yp.m_i = 0;
      local_258.vinfo.isPrimary = false;
      local_258.vinfo._13_3_ = 0;
      (*this->_vptr_QKmsDevice[8])
                (this,CONCAT44(extraout_var,iVar3),1,&vinfo,
                 (QArrayDataPointer<QPlatformScreen_*> *)(local_268 + 0x10));
      QArrayDataPointer<QPlatformScreen_*>::~QArrayDataPointer
                ((QArrayDataPointer<QPlatformScreen_*> *)(local_268 + 0x10));
      goto LAB_0011821a;
    }
    local_258.screen._0_4_ = 2;
    local_258.vinfo.isPrimary = false;
    local_258.vinfo._13_3_ = 0;
    local_258.screen._4_4_ = 0;
    local_258.vinfo.virtualIndex = 0;
    local_258.vinfo.virtualPos.xp.m_i = 0;
    local_258.vinfo.virtualPos.yp.m_i = 0;
    local_258.vinfo.output.name.d.d = (Data *)0x121389;
    QMessageLogger::warning
              (local_268 + 0x10,
               "QKmsDevice: Requested headless mode without support in the backend. Request is ignored."
              );
  }
  drmSetClientCap(this->m_dri_fd,2,1);
  iVar3 = drmSetClientCap(this->m_dri_fd,3,1);
  this->m_has_atomic_support = iVar3 == 0;
  if (iVar3 == 0) {
    qLcKmsDebug();
    if (((byte)qLcKmsDebug::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
      local_258.screen._0_4_ = 2;
      local_258.screen._4_4_ = 0;
      local_258.vinfo.virtualIndex = 0;
      local_258.vinfo.virtualPos.xp.m_i = 0;
      local_258.vinfo.virtualPos.yp.m_i = 0;
      local_258.vinfo.isPrimary = false;
      local_258.vinfo._13_3_ = 0;
      local_258.vinfo.output.name.d.d = (Data *)qLcKmsDebug::category.name;
      QMessageLogger::debug(local_268 + 0x10);
    }
    iVar3 = qEnvironmentVariableIntValue("QT_QPA_EGLFS_KMS_ATOMIC",(bool *)0x0);
    qLcKmsDebug();
    if (iVar3 == 0) {
      if (((byte)qLcKmsDebug::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
        local_258.screen._0_4_ = 2;
        local_258.screen._4_4_ = 0;
        local_258.vinfo.virtualIndex = 0;
        local_258.vinfo.virtualPos.xp.m_i = 0;
        local_258.vinfo.virtualPos.yp.m_i = 0;
        local_258.vinfo.isPrimary = false;
        local_258.vinfo._13_3_ = 0;
        local_258.vinfo.output.name.d.d = (Data *)qLcKmsDebug::category.name;
        QMessageLogger::debug(local_268 + 0x10,"Atomic disabled");
      }
      this->m_has_atomic_support = false;
    }
    else if (((byte)qLcKmsDebug::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0
            ) {
      local_258.screen._0_4_ = 2;
      local_258.screen._4_4_ = 0;
      local_258.vinfo.virtualIndex = 0;
      local_258.vinfo.virtualPos.xp.m_i = 0;
      local_258.vinfo.virtualPos.yp.m_i = 0;
      local_258.vinfo.isPrimary = false;
      local_258.vinfo._13_3_ = 0;
      local_258.vinfo.output.name.d.d = (Data *)qLcKmsDebug::category.name;
      QMessageLogger::debug(local_268 + 0x10,"Atomic enabled");
    }
  }
  resources = (drmModeResPtr)drmModeGetResources(this->m_dri_fd);
  if (resources == (drmModeResPtr)0x0) {
    piVar14 = __errno_location();
    qErrnoWarning(*piVar14,"drmModeGetResources failed");
  }
  else {
    discoverPlanes(this);
    local_58.size = 0;
    local_58.d = (Data *)0x0;
    local_58.ptr = (OrderedScreen *)0x0;
    ok = true;
    uVar4 = qEnvironmentVariableIntValue("QT_QPA_EGLFS_KMS_CONNECTOR_INDEX",&ok);
    uVar17 = 0xffffffff;
    if ((ok == true) &&
       (((int)uVar4 < 0 || (uVar17 = uVar4, resources->count_connectors <= (int)uVar4)))) {
      local_258.screen._0_4_ = 2;
      local_258.vinfo.isPrimary = false;
      local_258.vinfo._13_3_ = 0;
      local_258.screen._4_4_ = 0;
      local_258.vinfo.virtualIndex = 0;
      local_258.vinfo.virtualPos.xp.m_i = 0;
      local_258.vinfo.virtualPos.yp.m_i = 0;
      local_258.vinfo.output.name.d.d = (Data *)0x121389;
      QMessageLogger::warning
                (local_268 + 0x10,"Invalid connector index %d, must be between 0 and %u",
                 (ulong)uVar4,(ulong)(resources->count_connectors - 1));
      uVar17 = 0xffffffff;
    }
    for (uVar16 = 0; (long)uVar16 < (long)resources->count_connectors; uVar16 = uVar16 + 1) {
      if (((int)uVar17 < 0 || uVar17 == uVar16) &&
         (connector = (drmModeConnectorPtr)
                      drmModeGetConnector(this->m_dri_fd,resources->connectors[uVar16]),
         connector != (drmModeConnectorPtr)0x0)) {
        memcpy(&vinfo,&DAT_001228b8,0xf8);
        ScreenInfo::ScreenInfo(&vinfo);
        pQVar5 = createScreenForConnector(this,resources,connector,&vinfo);
        if (pQVar5 != (QPlatformScreen *)0x0) {
          local_258.screen._0_4_ = SUB84(pQVar5,0);
          local_258.screen._4_4_ = (undefined4)((ulong)pQVar5 >> 0x20);
          ScreenInfo::ScreenInfo(&local_258.vinfo,&vinfo);
          QList<OrderedScreen>::emplaceBack<OrderedScreen>
                    ((QList<OrderedScreen> *)&local_58,(OrderedScreen *)(local_268 + 0x10));
          QKmsOutput::~QKmsOutput(&local_258.vinfo.output);
        }
        drmModeFreeConnector(connector);
        QKmsOutput::~QKmsOutput(&vinfo.output);
      }
    }
    drmModeFreeResources(resources);
    iVar6 = QList<OrderedScreen>::begin((QList<OrderedScreen> *)&local_58);
    iVar7 = QList<OrderedScreen>::end((QList<OrderedScreen> *)&local_58);
    std::
    __stable_sort<QList<OrderedScreen>::iterator,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(OrderedScreen_const&,OrderedScreen_const&)>>
              (iVar6,iVar7,
               (_Iter_comp_iter<bool_(*)(const_OrderedScreen_&,_const_OrderedScreen_&)>)0x118806);
    qLcKmsDebug();
    if (((byte)qLcKmsDebug::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
      local_258.screen._0_4_ = 2;
      local_258.screen._4_4_ = 0;
      local_258.vinfo.virtualIndex = 0;
      local_258.vinfo.virtualPos.xp.m_i = 0;
      local_258.vinfo.virtualPos.yp.m_i = 0;
      local_258.vinfo.isPrimary = false;
      local_258.vinfo._13_3_ = 0;
      local_258.vinfo.output.name.d.d = (Data *)qLcKmsDebug::category.name;
      QMessageLogger::debug();
      pQVar8 = QDebug::operator<<((QDebug *)&vinfo,"Sorted screen list:");
      local_268._0_8_ = pQVar8->stream;
      *(int *)(local_268._0_8_ + 0x28) = *(int *)(local_268._0_8_ + 0x28) + 1;
      ::operator<<((Stream *)(local_268 + 8),(QList<OrderedScreen> *)local_268);
      QDebug::~QDebug((QDebug *)(local_268 + 8));
      QDebug::~QDebug((QDebug *)local_268);
      QDebug::~QDebug((QDebug *)&vinfo);
    }
    iVar6 = QList<OrderedScreen>::begin((QList<OrderedScreen> *)&local_58);
    iVar7 = QList<OrderedScreen>::end((QList<OrderedScreen> *)&local_58);
    for (; iVar6.i != iVar7.i; iVar6.i = iVar6.i + 1) {
      vinfo.virtualIndex = 0;
      vinfo.virtualPos.xp.m_i = 0;
      vinfo.virtualPos.yp.m_i = 0;
      vinfo.isPrimary = false;
      vinfo._13_3_ = 0;
      vinfo.output.name.d.d = (Data *)0x0;
      iVar9 = QList<OrderedScreen>::begin((QList<OrderedScreen> *)&local_58);
      iVar10 = QList<OrderedScreen>::end((QList<OrderedScreen> *)&local_58);
      for (; iVar9.i != iVar10.i; iVar9.i = iVar9.i + 1) {
        bVar2 = comparesEqual(&((iVar9.i)->vinfo).output.clone_source,
                              &((iVar6.i)->vinfo).output.name);
        if (bVar2) {
          QList<QPlatformScreen_*>::append((QList<QPlatformScreen_*> *)&vinfo,(iVar9.i)->screen);
        }
      }
      if (((iVar6.i)->vinfo).output.clone_source.d.size != 0) {
        iVar9 = QList<OrderedScreen>::begin((QList<OrderedScreen> *)&local_58);
        iVar10 = QList<OrderedScreen>::end((QList<OrderedScreen> *)&local_58);
        for (; iVar9.i != iVar10.i; iVar9.i = iVar9.i + 1) {
          bVar2 = comparesEqual(&((iVar9.i)->vinfo).output.name,
                                &((iVar6.i)->vinfo).output.clone_source);
          if (bVar2) {
            pQVar5 = (iVar9.i)->screen;
            if (pQVar5 != (QPlatformScreen *)0x0) {
              qLcKmsDebug();
              if (((byte)qLcKmsDebug::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1)
                  != 0) {
                local_258.screen._0_4_ = 2;
                local_258.screen._4_4_ = 0;
                local_258.vinfo.virtualIndex = 0;
                local_258.vinfo.virtualPos.xp.m_i = 0;
                local_258.vinfo.virtualPos.yp.m_i = 0;
                local_258.vinfo.isPrimary = false;
                local_258.vinfo._13_3_ = 0;
                local_258.vinfo.output.name.d.d = (Data *)qLcKmsDebug::category.name;
                QMessageLogger::debug();
                this_00 = (QArrayDataPointer<char16_t> *)(local_298 + 0x10);
                (**(code **)(*(long *)(iVar6.i)->screen + 0x90))(this_00);
                pQVar8 = QDebug::operator<<((QDebug *)&local_2d0,(QString *)this_00);
                pQVar8 = QDebug::operator<<(pQVar8,"clones");
                QDebug::operator<<(pQVar8,pQVar5);
                QArrayDataPointer<char16_t>::~QArrayDataPointer(this_00);
                QDebug::~QDebug((QDebug *)&local_2d0);
              }
              goto LAB_00117d78;
            }
            break;
          }
        }
      }
      pQVar5 = (QPlatformScreen *)0x0;
LAB_00117d78:
      if ((vinfo.output.name.d.d != (Data *)0x0) &&
         (qLcKmsDebug(),
         ((byte)qLcKmsDebug::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0)) {
        local_258.screen._0_4_ = 2;
        local_258.screen._4_4_ = 0;
        local_258.vinfo.virtualIndex = 0;
        local_258.vinfo.virtualPos.xp.m_i = 0;
        local_258.vinfo.virtualPos.yp.m_i = 0;
        local_258.vinfo.isPrimary = false;
        local_258.vinfo._13_3_ = 0;
        local_258.vinfo.output.name.d.d = (Data *)qLcKmsDebug::category.name;
        QMessageLogger::debug();
        (**(code **)(*(long *)(iVar6.i)->screen + 0x90))((QString *)(local_298 + 0x10));
        pQVar8 = QDebug::operator<<((QDebug *)&local_2d0,(QString *)(local_298 + 0x10));
        pQVar8 = QDebug::operator<<(pQVar8,"is cloned by");
        local_298._0_8_ = pQVar8->stream;
        *(int *)(local_298._0_8_ + 0x28) = *(int *)(local_298._0_8_ + 0x28) + 1;
        ::operator<<((Stream *)(local_298 + 8),(QList<QPlatformScreen_*> *)local_298);
        QDebug::~QDebug((QDebug *)(local_298 + 8));
        QDebug::~QDebug((QDebug *)local_298);
        QArrayDataPointer<char16_t>::~QArrayDataPointer
                  ((QArrayDataPointer<char16_t> *)(local_298 + 0x10));
        QDebug::~QDebug((QDebug *)&local_2d0);
      }
      (*this->_vptr_QKmsDevice[7])(this,(iVar6.i)->screen,pQVar5,&vinfo);
      QArrayDataPointer<QPlatformScreen_*>::~QArrayDataPointer
                ((QArrayDataPointer<QPlatformScreen_*> *)&vinfo);
    }
    vinfo.virtualIndex = 0;
    vinfo.virtualPos.xp.m_i = 0;
    vinfo.virtualPos.yp.m_i = 0;
    vinfo.isPrimary = false;
    vinfo._13_3_ = 0;
    vinfo.output.name.d.d = (Data *)0x0;
    local_298._16_8_ = 0;
    uStack_280 = 0;
    local_278 = 0;
    iVar6 = QList<OrderedScreen>::begin((QList<OrderedScreen> *)&local_58);
    iVar7 = QList<OrderedScreen>::end((QList<OrderedScreen> *)&local_58);
    local_300 = 0xffffffff;
    uVar16 = 0;
    uVar17 = 0;
    for (; iVar6.i != iVar7.i; iVar6.i = iVar6.i + 1) {
      t = (iVar6.i)->screen;
      if (((iVar6.i)->vinfo).virtualPos.yp.m_i == 0 && ((iVar6.i)->vinfo).virtualPos.xp.m_i == 0) {
        local_2a0 = (QPoint)(uVar16 | (ulong)uVar17 << 0x20);
        VVar1 = this->m_screenConfig->m_virtualDesktopLayout;
        auVar19 = (**(code **)(*(long *)t + 0x20))(t);
        if (VVar1 == VirtualDesktopLayoutVertical) {
          uVar17 = ((uVar17 + auVar19._12_4_) - auVar19._4_4_) + 1;
        }
        else {
          uVar16 = (ulong)((((int)uVar16 + auVar19._8_4_) - auVar19._0_4_) + 1);
        }
      }
      else {
        local_2a0 = ((iVar6.i)->vinfo).virtualPos;
      }
      qLcKmsDebug();
      if (((byte)qLcKmsDebug::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
        local_258.screen._0_4_ = 2;
        local_258.screen._4_4_ = 0;
        local_258.vinfo.virtualIndex = 0;
        local_258.vinfo.virtualPos.xp.m_i = 0;
        local_258.vinfo.virtualPos.yp.m_i = 0;
        local_258.vinfo.isPrimary = false;
        local_258.vinfo._13_3_ = 0;
        local_258.vinfo.output.name.d.d = (Data *)qLcKmsDebug::category.name;
        QMessageLogger::debug();
        pQVar8 = QDebug::operator<<(&local_2b8,"Adding QPlatformScreen");
        pQVar8 = QDebug::operator<<(pQVar8,t);
        pQVar8 = QDebug::operator<<(pQVar8,"(");
        (**(code **)(*(long *)t + 0x90))(&local_2d0,t);
        pQVar8 = QDebug::operator<<(pQVar8,(QString *)&local_2d0);
        pQVar8 = QDebug::operator<<(pQVar8,")");
        pQVar8 = QDebug::operator<<(pQVar8,"to QPA with geometry");
        local_2b0 = pQVar8->stream;
        *(int *)(local_2b0 + 0x28) = *(int *)(local_2b0 + 0x28) + 1;
        auVar19 = (**(code **)(*(long *)t + 0x20))(t);
        local_2e0 = auVar19;
        ::operator<<((Stream *)local_2a8,(QRect *)&local_2b0);
        pQVar8 = QDebug::operator<<((QDebug *)local_2a8,"and isPrimary=");
        QDebug::operator<<(pQVar8,((iVar6.i)->vinfo).isPrimary);
        QDebug::~QDebug((QDebug *)local_2a8);
        QDebug::~QDebug((QDebug *)&local_2b0);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_2d0);
        QDebug::~QDebug(&local_2b8);
      }
      if (this->m_screenConfig->m_separateScreens == false) {
        qLcKmsDebug();
        if (((byte)qLcKmsDebug::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0)
        {
          local_258.screen._0_4_ = 2;
          local_258.screen._4_4_ = 0;
          local_258.vinfo.virtualIndex = 0;
          local_258.vinfo.virtualPos.xp.m_i = 0;
          local_258.vinfo.virtualPos.yp.m_i = 0;
          local_258.vinfo.isPrimary = false;
          local_258.vinfo._13_3_ = 0;
          local_258.vinfo.output.name.d.d = (Data *)qLcKmsDebug::category.name;
          QMessageLogger::debug();
          pQVar11 = (QPoint *)QDebug::operator<<((QDebug *)&local_2d0,"  virtual position is");
          local_2f0 = *pQVar11;
          *(int *)((long)local_2f0 + 0x28) = *(int *)((long)local_2f0 + 0x28) + 1;
          ::operator<<((Stream *)local_2e8,&local_2f0);
          QDebug::~QDebug((QDebug *)local_2e8);
          QDebug::~QDebug((QDebug *)&local_2f0);
          QDebug::~QDebug((QDebug *)&local_2d0);
        }
        QList<QPlatformScreen_*>::append((QList<QPlatformScreen_*> *)&vinfo,t);
        QList<QPoint>::emplaceBack<QPoint_const&>((QList<QPoint> *)(local_298 + 0x10),&local_2a0);
        if (((iVar6.i)->vinfo).isPrimary != false) {
          local_300 = (int)vinfo.output.name.d.d - 1;
        }
      }
      else {
        bVar2 = ((iVar6.i)->vinfo).isPrimary;
        local_258.screen._0_4_ = 0;
        local_258.screen._4_4_ = 0;
        local_258.vinfo.virtualIndex = 0;
        local_258.vinfo.virtualPos.xp.m_i = 0;
        local_258.vinfo.virtualPos.yp.m_i = 0;
        local_258.vinfo.isPrimary = false;
        local_258.vinfo._13_3_ = 0;
        this_01 = (QArrayDataPointer<QPlatformScreen_*> *)(local_268 + 0x10);
        QList<QPlatformScreen_*>::append((QList<QPlatformScreen_*> *)this_01,t);
        (*this->_vptr_QKmsDevice[8])(this,t,(ulong)bVar2,&local_2a0,this_01);
        QArrayDataPointer<QPlatformScreen_*>::~QArrayDataPointer(this_01);
      }
    }
    if (this->m_screenConfig->m_separateScreens == false) {
      lVar18 = 0;
      for (pDVar15 = (Data *)0x0; pDVar15 < vinfo.output.name.d.d;
          pDVar15 = (Data *)((long)&(pDVar15->super_QArrayData).ref_._q_value.
                                    super___atomic_base<int>._M_i + 1)) {
        ppQVar12 = QList<QPlatformScreen_*>::data((QList<QPlatformScreen_*> *)&vinfo);
        pQVar5 = ppQVar12[(long)pDVar15];
        pQVar13 = QList<QPoint>::data((QList<QPoint> *)(local_298 + 0x10));
        (*this->_vptr_QKmsDevice[8])
                  (this,pQVar5,(ulong)((Data *)(ulong)local_300 == pDVar15),
                   (long)&(pQVar13->xp).m_i + lVar18,&vinfo);
        lVar18 = lVar18 + 8;
      }
    }
    QArrayDataPointer<QPoint>::~QArrayDataPointer((QArrayDataPointer<QPoint> *)(local_298 + 0x10));
    QArrayDataPointer<QPlatformScreen_*>::~QArrayDataPointer
              ((QArrayDataPointer<QPlatformScreen_*> *)&vinfo);
    QArrayDataPointer<OrderedScreen>::~QArrayDataPointer(&local_58);
  }
LAB_0011821a:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QKmsDevice::createScreens()
{
    // Headless mode using a render node: cannot do any output related DRM
    // stuff. Skip it all and register a dummy screen.
    if (m_screenConfig->headless()) {
        QPlatformScreen *screen = createHeadlessScreen();
        if (screen) {
            qCDebug(qLcKmsDebug, "Headless mode enabled");
            registerScreen(screen, true, QPoint(0, 0), QList<QPlatformScreen *>());
            return;
        } else {
            qWarning("QKmsDevice: Requested headless mode without support in the backend. Request is ignored.");
        }
    }

    drmSetClientCap(m_dri_fd, DRM_CLIENT_CAP_UNIVERSAL_PLANES, 1);

#if QT_CONFIG(drm_atomic)
    // check atomic support
    m_has_atomic_support = !drmSetClientCap(m_dri_fd, DRM_CLIENT_CAP_ATOMIC, 1);
    if (m_has_atomic_support) {
        qCDebug(qLcKmsDebug, "Atomic reported as supported");
        if (qEnvironmentVariableIntValue("QT_QPA_EGLFS_KMS_ATOMIC")) {
            qCDebug(qLcKmsDebug, "Atomic enabled");
        } else {
            qCDebug(qLcKmsDebug, "Atomic disabled");
            m_has_atomic_support = false;
        }
    }
#endif

    drmModeResPtr resources = drmModeGetResources(m_dri_fd);
    if (!resources) {
        qErrnoWarning(errno, "drmModeGetResources failed");
        return;
    }

    discoverPlanes();

    QList<OrderedScreen> screens;

    int wantedConnectorIndex = -1;
    bool ok;
    int idx = qEnvironmentVariableIntValue("QT_QPA_EGLFS_KMS_CONNECTOR_INDEX", &ok);
    if (ok) {
        if (idx >= 0 && idx < resources->count_connectors)
            wantedConnectorIndex = idx;
        else
            qWarning("Invalid connector index %d, must be between 0 and %u", idx, resources->count_connectors - 1);
    }

    for (int i = 0; i < resources->count_connectors; i++) {
        if (wantedConnectorIndex >= 0 && i != wantedConnectorIndex)
            continue;

        drmModeConnectorPtr connector = drmModeGetConnector(m_dri_fd, resources->connectors[i]);
        if (!connector)
            continue;

        ScreenInfo vinfo;
        QPlatformScreen *screen = createScreenForConnector(resources, connector, &vinfo);
        if (screen)
            screens.append(OrderedScreen(screen, vinfo));

        drmModeFreeConnector(connector);
    }

    drmModeFreeResources(resources);

    // Use stable sort to preserve the original (DRM connector) order
    // for outputs with unspecified indices.
    std::stable_sort(screens.begin(), screens.end(), orderedScreenLessThan);
    qCDebug(qLcKmsDebug) << "Sorted screen list:" << screens;

    // The final list of screens is available, so do the second phase setup.
    // Hook up clone sources and targets.
    for (const OrderedScreen &orderedScreen : screens) {
        QList<QPlatformScreen *> screensCloningThisScreen;
        for (const OrderedScreen &s : screens) {
            if (s.vinfo.output.clone_source == orderedScreen.vinfo.output.name)
                screensCloningThisScreen.append(s.screen);
        }
        QPlatformScreen *screenThisScreenClones = nullptr;
        if (!orderedScreen.vinfo.output.clone_source.isEmpty()) {
            for (const OrderedScreen &s : screens) {
                if (s.vinfo.output.name == orderedScreen.vinfo.output.clone_source) {
                    screenThisScreenClones = s.screen;
                    break;
                }
            }
        }
        if (screenThisScreenClones)
            qCDebug(qLcKmsDebug) << orderedScreen.screen->name() << "clones" << screenThisScreenClones;
        if (!screensCloningThisScreen.isEmpty())
            qCDebug(qLcKmsDebug) << orderedScreen.screen->name() << "is cloned by" << screensCloningThisScreen;

        registerScreenCloning(orderedScreen.screen, screenThisScreenClones, screensCloningThisScreen);
    }

    // Figure out the virtual desktop and register the screens to QPA/QGuiApplication.
    QPoint pos(0, 0);
    QList<QPlatformScreen *> siblings;
    QList<QPoint> virtualPositions;
    int primarySiblingIdx = -1;

    for (const OrderedScreen &orderedScreen : screens) {
        QPlatformScreen *s = orderedScreen.screen;
        QPoint virtualPos(0, 0);
        // set up a horizontal or vertical virtual desktop
        if (orderedScreen.vinfo.virtualPos.isNull()) {
            virtualPos = pos;
            if (m_screenConfig->virtualDesktopLayout() == QKmsScreenConfig::VirtualDesktopLayoutVertical)
                pos.ry() += s->geometry().height();
            else
                pos.rx() += s->geometry().width();
        } else {
            virtualPos = orderedScreen.vinfo.virtualPos;
        }
        qCDebug(qLcKmsDebug) << "Adding QPlatformScreen" << s << "(" << s->name() << ")"
                             << "to QPA with geometry" << s->geometry()
                             << "and isPrimary=" << orderedScreen.vinfo.isPrimary;
        // The order in qguiapp's screens list will match the order set by
        // virtualIndex. This is not only handy but also required since for instance
        // evdevtouch relies on it when performing touch device - screen mapping.
        if (!m_screenConfig->separateScreens()) {
            qCDebug(qLcKmsDebug) << "  virtual position is" << virtualPos;
            siblings.append(s);
            virtualPositions.append(virtualPos);
            if (orderedScreen.vinfo.isPrimary)
                primarySiblingIdx = siblings.size() - 1;
        } else {
            registerScreen(s, orderedScreen.vinfo.isPrimary, virtualPos, QList<QPlatformScreen *>() << s);
        }
    }

    if (!m_screenConfig->separateScreens()) {
        // enable the virtual desktop
        for (int i = 0; i < siblings.size(); ++i)
            registerScreen(siblings[i], i == primarySiblingIdx, virtualPositions[i], siblings);
    }
}